

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O1

void __thiscall jrtplib::RTCPScheduler::CalculateNextRTCPTime(RTCPScheduler *this)

{
  RTPInternalSourceData *pRVar1;
  bool sender;
  double dVar2;
  RTPTime RVar3;
  double extraout_XMM0_Qa;
  timespec tpMono;
  timespec tpMono_1;
  timespec local_40;
  timespec local_30;
  
  pRVar1 = this->sources->owndata;
  if (pRVar1 == (RTPInternalSourceData *)0x0) {
    sender = false;
  }
  else {
    sender = (pRVar1->super_RTPSourceData).issender;
  }
  if (RTPTime::CurrentTime()::s_initialized == '\0') {
    RTPTime::CurrentTime()::s_initialized = '\x01';
    clock_gettime(0,&local_40);
    clock_gettime(1,&local_30);
    dVar2 = (double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec;
    RTPTime::CurrentTime()::s_startOffet =
         dVar2 - ((double)local_30.tv_nsec * 1e-09 + (double)local_30.tv_sec);
  }
  else {
    clock_gettime(1,&local_40);
    dVar2 = (double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec +
            RTPTime::CurrentTime()::s_startOffet;
  }
  (this->nextrtcptime).m_t = dVar2;
  RVar3 = CalculateDeterministicInterval(this,sender);
  (*this->rtprand->_vptr_RTPRandom[5])();
  (this->nextrtcptime).m_t =
       ((extraout_XMM0_Qa + 0.5) * RVar3.m_t) / 1.21828 + (this->nextrtcptime).m_t;
  return;
}

Assistant:

void RTCPScheduler::CalculateNextRTCPTime()
{
	bool aresender = false;
	RTPSourceData *srcdat;
	
	if ((srcdat = sources.GetOwnSourceInfo()) != 0)
		aresender = srcdat->IsSender();
	
	nextrtcptime = RTPTime::CurrentTime();	
	nextrtcptime += CalculateTransmissionInterval(aresender);
}